

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnyDistributionEdgeCalculator.cpp
# Opt level: O1

int __thiscall
AnyDistributionEdgeCalculator::computeAllowableInsertSizeDiff(AnyDistributionEdgeCalculator *this)

{
  double *pdVar1;
  pointer pdVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  pointer pdVar9;
  ulong uVar10;
  ulong uVar11;
  int unaff_R14D;
  double dVar12;
  vector<double,_std::allocator<double>_> diff_dist;
  allocator_type local_31;
  vector<double,_std::allocator<double>_> local_30;
  value_type_conflict4 local_18;
  
  local_18 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_30,
             (long)(this->insert_size_dist->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->insert_size_dist->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 2,&local_18,&local_31);
  pdVar2 = (this->insert_size_dist->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = (long)(this->insert_size_dist->super__Vector_base<double,_std::allocator<double>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2;
  if (lVar6 != 0) {
    uVar7 = lVar6 >> 3;
    pdVar9 = pdVar2;
    uVar10 = 0;
    do {
      *local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = pdVar2[uVar10] * pdVar2[uVar10] +
                  *local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
      uVar11 = uVar10 + 1;
      if (uVar11 < uVar7) {
        lVar6 = 1;
        do {
          local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar6] =
               pdVar2[uVar10] * pdVar9[lVar6] + pdVar2[uVar10] * pdVar9[lVar6] +
               local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar6];
          lVar8 = uVar10 + lVar6;
          lVar6 = lVar6 + 1;
        } while (lVar8 + 1U < uVar7);
      }
      pdVar9 = pdVar9 + 1;
      uVar10 = uVar11;
    } while (uVar11 != uVar7 + (uVar7 == 0));
  }
  uVar4 = (uint)((ulong)((long)local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3);
  uVar5 = uVar4 - 2;
  if (-1 < (int)uVar5) {
    dVar12 = local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[(ulong)uVar5 + 1];
    lVar6 = (ulong)uVar5 + 1;
    do {
      dVar12 = dVar12 + local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar6 + -1];
      local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar6 + -1] = dVar12;
      lVar8 = lVar6 + -1;
      bVar3 = 0 < lVar6;
      lVar6 = lVar8;
    } while (lVar8 != 0 && bVar3);
  }
  if (1 < (int)uVar4) {
    dVar12 = this->significance_level;
    uVar10 = 0;
    unaff_R14D = 0;
    if (dVar12 < local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[1] ||
        dVar12 == local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[1]) {
      uVar7 = 2;
      do {
        unaff_R14D = (int)uVar10;
        if ((uVar4 & 0x7fffffff) == uVar7) goto LAB_00163080;
        uVar10 = uVar7 + 1;
        pdVar1 = local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar7;
        uVar7 = uVar10;
      } while (dVar12 < *pdVar1 || dVar12 == *pdVar1);
      unaff_R14D = (int)uVar10 + -2;
    }
  }
LAB_00163080:
  if (local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return unaff_R14D;
}

Assistant:

int AnyDistributionEdgeCalculator::computeAllowableInsertSizeDiff() {
	// first compute distribution of (absolute) differences of two independently sampled insert lengths
	vector<double> diff_dist(2*insert_size_dist->size(), 0.0);
	for (size_t i=0; i<insert_size_dist->size(); ++i) {
		diff_dist[0] += insert_size_dist->at(i) * insert_size_dist->at(i);
		for (size_t j=i+1; j<insert_size_dist->size(); ++j) {
			diff_dist[j-i] += 2 * (insert_size_dist->at(i) * insert_size_dist->at(j));
		}
	}
	// compute right-cumulative distribution
	for (int i=diff_dist.size()-2; i>=0; --i) {
		diff_dist[i] += diff_dist[i+1];
	}
	// determine largest difference k such that P(diff >= k) >= significance_level
	for (int k=1; k < (int)diff_dist.size(); ++k) {
		if (diff_dist[k] < significance_level) return k-1;
	}
	assert(false);
}